

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall pstd::array<float,_3>::array(array<float,_3> *this,initializer_list<float> v)

{
  const_iterator pfVar1;
  initializer_list<float> *in_RDI;
  float *val;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<float> *__range2;
  size_t i;
  initializer_list<float> *this_00;
  initializer_list<float> *local_48;
  const_iterator local_30;
  long local_20;
  initializer_list<float> local_10;
  
  this_00 = (initializer_list<float> *)((long)&in_RDI->_M_len + 4);
  local_48 = in_RDI;
  do {
    *(undefined4 *)&local_48->_M_array = 0;
    local_48 = (initializer_list<float> *)((long)&local_48->_M_array + 4);
  } while (local_48 != this_00);
  local_20 = 0;
  local_30 = std::initializer_list<float>::begin(&local_10);
  pfVar1 = std::initializer_list<float>::end(this_00);
  for (; local_30 != pfVar1; local_30 = local_30 + 1) {
    *(float *)((long)&in_RDI->_M_array + local_20 * 4) = *local_30;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    array(std::initializer_list<T> v) {
        size_t i = 0;
        for (const T &val : v)
            values[i++] = val;
    }